

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_dir_path.c
# Opt level: O3

char * make_dir_path(char *path,mode_t mode)

{
  int iVar1;
  size_t sVar2;
  char *__path;
  int *piVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  
  lVar6 = 0;
  while( true ) {
    sVar2 = strcspn(path + (int)lVar6,"/");
    iVar5 = (int)(sVar2 + lVar6);
    if (0 < iVar5) {
      __path = dupprintf("%.*s",sVar2 + lVar6 & 0xffffffff,path);
      iVar1 = mkdir(__path,mode);
      if (iVar1 < 0) {
        piVar3 = __errno_location();
        if (*piVar3 != 0x11) {
          pcVar4 = strerror(*piVar3);
          pcVar4 = dupprintf("%s: mkdir: %s",__path,pcVar4);
          safefree(__path);
          return pcVar4;
        }
      }
      safefree(__path);
    }
    lVar6 = (long)iVar5;
    if (path[lVar6] == '\0') break;
    sVar2 = strspn(path + lVar6,"/");
    lVar6 = sVar2 + lVar6;
  }
  return (char *)0x0;
}

Assistant:

char *make_dir_path(const char *path, mode_t mode)
{
    int pos = 0;
    char *prefix;

    while (1) {
        pos += strcspn(path + pos, "/");

        if (pos > 0) {
            prefix = dupprintf("%.*s", pos, path);

            if (mkdir(prefix, mode) < 0 && errno != EEXIST) {
                char *ret = dupprintf("%s: mkdir: %s",
                                      prefix, strerror(errno));
                sfree(prefix);
                return ret;
            }

            sfree(prefix);
        }

        if (!path[pos])
            return NULL;
        pos += strspn(path + pos, "/");
    }
}